

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penalty_optimizer.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
penalty_optimizer::optimize
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,penalty_optimizer *this,
          vector<float,_std::allocator<float>_> *start_parameters)

{
  ostream *poVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  vector<float,_std::allocator<float>_> new_parameters;
  nelder_mead mead_optimizer;
  vector<float,_std::allocator<float>_> local_108;
  void *local_f0 [2];
  long local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  undefined1 local_98 [16];
  float local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  nelder_mead local_78;
  
  nelder_mead::nelder_mead
            (&local_78,
             (int)((ulong)((long)(start_parameters->
                                 super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(start_parameters->super__Vector_base<float,_std::allocator<float>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,start_parameters);
  uVar2 = 0;
  fVar3 = 10.0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    local_a8 = fVar3;
    uStack_a4 = uVar5;
    uStack_a0 = uVar6;
    uStack_9c = uVar7;
    (*(((this->_estimator).super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_error_estimator)._vptr_error_estimator[3])();
    std::vector<float,_std::allocator<float>_>::vector(&local_d8,__return_storage_ptr__);
    nelder_mead::optimize
              (&local_c0,&local_78,&local_d8,
               &((this->_estimator).
                 super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_error_estimator);
    if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    vector_utils::sub(&local_108,__return_storage_ptr__,&local_c0);
    vector_utils::abs((vector_utils *)local_f0,(int)&local_108);
    fVar3 = vector_utils::sum((vector<float,_std::allocator<float>_> *)local_f0);
    if (local_f0[0] != (void *)0x0) {
      operator_delete(local_f0[0],local_e0 - (long)local_f0[0]);
    }
    if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::vector<float,_std::allocator<float>_>::operator=(__return_storage_ptr__,&local_c0);
    fVar4 = local_a8 * 0.1;
    uVar5 = uStack_a4;
    uVar6 = uStack_a0;
    uVar7 = uStack_9c;
    uVar8 = -(uint)(fVar3 < 0.0001);
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      uStack_84 = uStack_a4;
      uStack_80 = uStack_a0;
      uStack_7c = uStack_9c;
      local_98 = ZEXT416(-(uint)(fVar3 < 0.0001));
      local_88 = local_a8 * 0.1;
      operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
      fVar4 = local_88;
      uVar5 = uStack_84;
      uVar6 = uStack_80;
      uVar7 = uStack_7c;
      uVar8 = local_98._0_4_;
      uVar9 = local_98._4_4_;
      uVar10 = local_98._8_4_;
      uVar11 = local_98._12_4_;
    }
    if (fVar3 < 0.0001) goto LAB_0017d739;
    fVar3 = (float)((uint)local_a8 & uVar8 | ~uVar8 & (uint)fVar4);
    uVar5 = uStack_a4 & uVar9 | ~uVar9 & uVar5;
    uVar6 = uStack_a0 & uVar10 | ~uVar10 & uVar6;
    uVar7 = uStack_9c & uVar11 | ~uVar11 & uVar7;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 10);
  uVar2 = 10;
LAB_0017d739:
  if (9 < uVar2) {
    poVar1 = log_info();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"[Penalty optimizer] Maximum number of iterations reached (",0x3a);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  local_78._vptr_nelder_mead = (_func_int **)&PTR__nelder_mead_001f4b60;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_78._simplex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> penalty_optimizer::optimize(const std::vector<float>& start_parameters) const
{
  float penalty_value = 10.0f;
  const float penalty_multipler = 0.1f;

  nelder_mead mead_optimizer(start_parameters.size());

  auto current_parameters = start_parameters;
  const float acceptable_step_norm = 1e-4f;

  const int max_iterations = 10;
  int iteration = 0;

  for (; iteration < max_iterations; ++iteration)
  {
    _estimator->set_penalty_factor(penalty_value);
    auto new_parameters = mead_optimizer.optimize(current_parameters, _estimator.get());

    auto norm = vector_utils::sum(vector_utils::abs(vector_utils::sub(current_parameters, new_parameters)));
    
    current_parameters = new_parameters;

    if (norm < acceptable_step_norm)
    {
      break;
    }

    penalty_value *= penalty_multipler;
  }

  if (iteration >= max_iterations)
  {
    log_info() << "[Penalty optimizer] Maximum number of iterations reached (" << max_iterations << ")." << std::endl;
  }

  return current_parameters;
}